

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

int __thiscall Fossilize::Instance::init(Instance *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  void *pvVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  LogLevel LVar6;
  uint uVar7;
  char *pcVar8;
  ApplicationInfoFilter *pAVar9;
  VkApplicationInfo *pVVar10;
  size_t sVar11;
  VkLayerInstanceDispatchTable *in_RCX;
  undefined8 *in_RDX;
  PFN_vkGetInstanceProcAddr in_R8;
  
  std::mutex::lock((mutex *)globalInfoFilterLock);
  if (globalInfoFilterDone == '\0') {
    pcVar8 = getenv("FOSSILIZE_APPLICATION_INFO_FILTER_PATH");
    if (pcVar8 != (char *)0x0) {
      pAVar9 = ApplicationInfoFilter::parse
                         (pcVar8,getApplicationInfoFilter::anon_class_1_0_00000001::__invoke,
                          (void *)0x0);
      std::
      __uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
      ::reset((__uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
               *)&globalInfoFilter,pAVar9);
      if (globalInfoFilter == (ApplicationInfoFilter *)0x0) {
        LVar6 = get_thread_log_level();
        if ((int)LVar6 < 3) {
          bVar5 = Internal::log_thread_callback
                            (LOG_ERROR,
                             "Failed to parse ApplicationInfoFilter, letting recording go through.\n"
                            );
          if (!bVar5) {
            fwrite("Fossilize ERROR: Failed to parse ApplicationInfoFilter, letting recording go through.\n"
                   ,0x56,1,_stderr);
          }
        }
      }
    }
    globalInfoFilterDone = '\x01';
  }
  pAVar9 = globalInfoFilter;
  uVar7 = pthread_mutex_unlock((pthread_mutex_t *)globalInfoFilterLock);
  pVVar10 = (VkApplicationInfo *)(ulong)uVar7;
  this->infoFilter = pAVar9;
  this->instance = (VkInstance)ctx;
  this->pTable = in_RCX;
  this->gpa = in_R8;
  if ((in_RDX != (undefined8 *)0x0) && (in_RDX[1] == 0)) {
    pVVar10 = ScratchAllocator::allocate<VkApplicationInfo>(&this->alloc);
    this->pAppInfo = pVVar10;
    uVar1 = *in_RDX;
    pvVar2 = (void *)in_RDX[1];
    pcVar8 = (char *)in_RDX[2];
    uVar3 = in_RDX[3];
    uVar4 = in_RDX[5];
    pVVar10->pEngineName = (char *)in_RDX[4];
    pVVar10->engineVersion = (int)uVar4;
    pVVar10->apiVersion = (int)((ulong)uVar4 >> 0x20);
    pVVar10->pApplicationName = pcVar8;
    *(undefined8 *)&pVVar10->applicationVersion = uVar3;
    *(undefined8 *)pVVar10 = uVar1;
    pVVar10->pNext = pvVar2;
    if ((char *)in_RDX[2] != (char *)0x0) {
      sVar11 = strlen((char *)in_RDX[2]);
      pcVar8 = ScratchAllocator::allocate_n<char>(&this->alloc,sVar11 + 1);
      memcpy(pcVar8,(void *)in_RDX[2],sVar11 + 1);
      pVVar10 = this->pAppInfo;
      pVVar10->pApplicationName = pcVar8;
    }
    if ((char *)in_RDX[4] != (char *)0x0) {
      sVar11 = strlen((char *)in_RDX[4]);
      pcVar8 = ScratchAllocator::allocate_n<char>(&this->alloc,sVar11 + 1);
      memcpy(pcVar8,(void *)in_RDX[4],sVar11 + 1);
      pVVar10 = this->pAppInfo;
      pVVar10->pEngineName = pcVar8;
    }
  }
  return (int)pVVar10;
}

Assistant:

void Instance::init(VkInstance instance_, const VkApplicationInfo *pApp, VkLayerInstanceDispatchTable *pTable_, PFN_vkGetInstanceProcAddr gpa_)
{
	infoFilter = getApplicationInfoFilter();
	instance = instance_;
	pTable = pTable_;
	gpa = gpa_;

	// pNext in appInfo is not supported.
	if (pApp && !pApp->pNext)
	{
		pAppInfo = alloc.allocate<VkApplicationInfo>();
		*pAppInfo = *pApp;

		if (pApp->pApplicationName)
		{
			size_t len = strlen(pApp->pApplicationName) + 1;
			char *pAppName = alloc.allocate_n<char>(len);
			memcpy(pAppName, pApp->pApplicationName, len);
			pAppInfo->pApplicationName = pAppName;
		}

		if (pApp->pEngineName)
		{
			size_t len = strlen(pApp->pEngineName) + 1;
			char *pEngineName = alloc.allocate_n<char>(len);
			memcpy(pEngineName, pApp->pEngineName, len);
			pAppInfo->pEngineName = pEngineName;
		}
	}
}